

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixSlice.h
# Opt level: O3

void __thiscall
HighsMatrixSlice<HighsTripletTreeSliceInOrder>::iterator::iterator
          (iterator *this,HighsInt *nodeIndex,double *nodeValue,HighsInt *nodeLeft,
          HighsInt *nodeRight,HighsInt node)

{
  vector<int,_std::allocator<int>_> *this_00;
  HighsInt *__args;
  double **ppdVar1;
  int iVar2;
  int iVar3;
  iterator iVar4;
  long lVar5;
  int local_24;
  
  (this->pos_).index_ = nodeIndex;
  (this->pos_).value_ = nodeValue;
  this->nodeLeft = nodeLeft;
  this->nodeRight = nodeRight;
  this_00 = &this->stack;
  (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->currentNode = node;
  std::vector<int,_std::allocator<int>_>::reserve(this_00,0x10);
  iVar4._M_current =
       (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar4._M_current ==
      (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar4,&local_24);
  }
  else {
    *iVar4._M_current = -1;
    (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current + 1;
  }
  __args = &this->currentNode;
  iVar2 = *__args;
  lVar5 = (long)iVar2;
  if (lVar5 != -1) {
    iVar3 = nodeLeft[lVar5];
    while (iVar3 != -1) {
      iVar4._M_current =
           (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)this_00,iVar4,__args);
      }
      else {
        *iVar4._M_current = iVar2;
        (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar4._M_current + 1;
      }
      iVar2 = nodeLeft[*__args];
      *__args = iVar2;
      lVar5 = (long)iVar2;
      iVar3 = nodeLeft[lVar5];
    }
    (this->pos_).index_ = (this->pos_).index_ + lVar5;
    ppdVar1 = &(this->pos_).value_;
    *ppdVar1 = *ppdVar1 + lVar5;
  }
  return;
}

Assistant:

iterator(const HighsInt* nodeIndex, const double* nodeValue,
             const HighsInt* nodeLeft, const HighsInt* nodeRight, HighsInt node)
        : pos_(nodeIndex, nodeValue),
          nodeLeft(nodeLeft),
          nodeRight(nodeRight),
          currentNode(node) {
      stack.reserve(16);
      stack.push_back(-1);
      if (currentNode == -1) return;
      while (nodeLeft[currentNode] != -1) {
        stack.push_back(currentNode);
        currentNode = nodeLeft[currentNode];
      }

      pos_.index_ += currentNode;
      pos_.value_ += currentNode;
    }